

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreateEntityReliablePdu.cpp
# Opt level: O3

void __thiscall DIS::CreateEntityReliablePdu::CreateEntityReliablePdu(CreateEntityReliablePdu *this)

{
  SimulationManagementWithReliabilityFamilyPdu::SimulationManagementWithReliabilityFamilyPdu
            (&this->super_SimulationManagementWithReliabilityFamilyPdu);
  (this->super_SimulationManagementWithReliabilityFamilyPdu).super_Pdu.super_PduSuperclass.
  _vptr_PduSuperclass = (_func_int **)&PTR__CreateEntityReliablePdu_001b3e08;
  this->_requiredReliabilityService = '\0';
  this->_pad1 = 0;
  this->_pad2 = '\0';
  this->_requestID = 0;
  PduSuperclass::setPduType((PduSuperclass *)this,'3');
  return;
}

Assistant:

CreateEntityReliablePdu::CreateEntityReliablePdu() : SimulationManagementWithReliabilityFamilyPdu(),
   _requiredReliabilityService(0), 
   _pad1(0), 
   _pad2(0), 
   _requestID(0)
{
    setPduType( 51 );
}